

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_pow.c
# Opt level: O0

size_t zzPowerMod_deep(size_t n,size_t m)

{
  size_t m_00;
  size_t sVar1;
  size_t sVar2;
  long in_RDI;
  size_t r_deep;
  size_t no;
  size_t in_stack_ffffffffffffffe0;
  
  m_00 = in_RDI << 3;
  sVar1 = zmCreate_deep(in_stack_ffffffffffffffe0);
  sVar2 = qrPower_deep(sVar1,m_00,sVar1);
  sVar1 = utilMax(2,sVar1,sVar2);
  return m_00 + sVar1;
}

Assistant:

size_t zzPowerMod_deep(size_t n, size_t m)
{
	const size_t no = O_OF_W(n);
	const size_t r_deep = zmCreate_deep(no);
	return no + 
		utilMax(2,
			r_deep,
			qrPower_deep(n, m, r_deep));
}